

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::Optional<Catch::ReporterSpec>::reset(Optional<Catch::ReporterSpec> *this)

{
  if (this->nullableValue != (ReporterSpec *)0x0) {
    ReporterSpec::~ReporterSpec(this->nullableValue);
  }
  this->nullableValue = (ReporterSpec *)0x0;
  return;
}

Assistant:

void reset() {
            if ( nullableValue ) { nullableValue->~T(); }
            nullableValue = nullptr;
        }